

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall
QGraphicsWidget::paintWindowFrame
          (QWindow *this,QPainter *painter,QStyleOptionGraphicsItem *option,QWidget *widget)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QGraphicsProxyWidget *pQVar4;
  QWidget *pQVar5;
  ulong uVar6;
  QBrush *pQVar7;
  QStyle *pQVar8;
  undefined8 in_RCX;
  long in_RDX;
  QStyleOptionTitleBar *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool isActive;
  int height;
  int frameWidth;
  bool hasBorder;
  bool setMask;
  QGraphicsWidgetPrivate *d;
  bool embeddedWidgetFillsOwnBackground;
  QGraphicsProxyWidget *proxy;
  bool fillBackground;
  QPainterPath windowFrameBackground;
  QStyleHintReturnMask mask;
  QPointF styleOrigin;
  QRect windowFrameRect;
  QStyleOptionFrame frameOptions;
  QStyleOptionTitleBar bar;
  undefined4 in_stack_fffffffffffffce8;
  WidgetAttribute in_stack_fffffffffffffcec;
  QGraphicsWidgetPrivate *in_stack_fffffffffffffcf0;
  QStyleOptionTitleBar *pQVar9;
  QStyleOptionTitleBar *in_stack_fffffffffffffcf8;
  QGraphicsWidgetPrivate *in_stack_fffffffffffffd00;
  QStyleOptionTitleBar *in_stack_fffffffffffffd08;
  QStyleOptionTitleBar *in_stack_fffffffffffffd10;
  QGraphicsWidget *in_stack_fffffffffffffd18;
  QGraphicsWidget *this_00;
  QRectF *this_01;
  undefined7 in_stack_fffffffffffffd28;
  byte bVar10;
  QStyleOptionTitleBar *in_stack_fffffffffffffd30;
  QGraphicsWidgetPrivate *in_stack_fffffffffffffd38;
  byte local_2ae;
  QRect local_260;
  QPointF local_250;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  QPointF local_188;
  QSizeF local_158;
  QSize local_148;
  undefined1 *local_138;
  _func_int **local_130;
  undefined1 local_128 [32];
  undefined1 local_108 [8];
  undefined1 auStack_100 [16];
  _func_int **local_f0;
  QPalette QStack_e0;
  undefined4 local_c8;
  undefined4 local_c4;
  QFont local_b8 [16];
  QPalette local_a8;
  QPalette local_98;
  undefined1 local_88 [8];
  undefined1 auStack_80 [16];
  _func_int **local_70;
  QPalette local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = testAttribute((QGraphicsWidget *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
  local_2ae = 0;
  if (!bVar1) {
    bVar1 = testAttribute((QGraphicsWidget *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
    local_2ae = bVar1 ^ 0xff;
  }
  pQVar4 = qobject_cast<QGraphicsProxyWidget*>((QObject *)0xa4f6ac);
  bVar1 = false;
  if (pQVar4 != (QGraphicsProxyWidget *)0x0) {
    pQVar5 = QGraphicsProxyWidget::widget((QGraphicsProxyWidget *)in_stack_fffffffffffffcf0);
    bVar1 = pQVar5 != (QWidget *)0x0;
  }
  rect((QGraphicsWidget *)in_stack_fffffffffffffd08);
  uVar6 = QRectF::contains((QRectF *)local_128);
  if ((uVar6 & 1) == 0) {
    d_func((QGraphicsWidget *)0xa4f79a);
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    local_130 = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffcf0);
    windowFrameGeometry(in_stack_fffffffffffffd18);
    local_158 = QRectF::size((QRectF *)in_stack_fffffffffffffcf8);
    local_148 = QSizeF::toSize((QSizeF *)in_stack_fffffffffffffd00);
    QRect::QRect((QRect *)in_stack_fffffffffffffd10,(QPoint *)in_stack_fffffffffffffd08,
                 (QSize *)in_stack_fffffffffffffd00);
    memset(local_88,0xaa,0x70);
    QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)0xa4f851);
    QStyleOption::operator=
              ((QStyleOption *)in_stack_fffffffffffffcf0,
               (QStyleOption *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    QGraphicsWidgetPrivate::initStyleOptionTitleBar
              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    QGraphicsWidgetPrivate::ensureWindowData(in_stack_fffffffffffffcf0);
    this_00 = (QGraphicsWidget *)auStack_80;
    std::
    unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
    ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                  *)0xa4f8a4);
    QFlags<QStyle::StateFlag>::setFlag
              ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffd10,
               (StateFlag)((ulong)in_stack_fffffffffffffd08 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
    this_01 = (QRectF *)auStack_80;
    std::
    unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
    ::operator->((unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                  *)0xa4f8e9);
    QFlags<QStyle::StateFlag>::setFlag
              ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffd10,
               (StateFlag)((ulong)in_stack_fffffffffffffd08 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
    auStack_80._8_8_ = local_138;
    local_70 = local_130;
    local_188.yp = -NAN;
    local_188.xp = -NAN;
    QGraphicsWidget::windowFrameRect(this_00);
    local_188 = QRectF::topLeft((QRectF *)in_stack_fffffffffffffcf8);
    QPainter::translate((QPointF *)in_RSI);
    local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleHintReturnMask::QStyleHintReturnMask((QStyleHintReturnMask *)in_stack_fffffffffffffcf0);
    pQVar8 = style((QGraphicsWidget *)in_stack_fffffffffffffcf8);
    iVar3 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x37,local_88,in_RCX,&local_1b8);
    bVar10 = 0;
    if (iVar3 != 0) {
      bVar10 = QRegion::isEmpty();
      bVar10 = bVar10 ^ 0xff;
    }
    bVar2 = bVar10 & 1;
    pQVar8 = style((QGraphicsWidget *)in_stack_fffffffffffffcf8);
    iVar3 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x1a,local_88,in_RCX,0);
    pQVar8 = style((QGraphicsWidget *)in_stack_fffffffffffffcf8);
    (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x2c,local_88,in_RCX);
    if (bVar2 != 0) {
      QPainter::save();
      QPainter::setClipRegion((QRegion *)in_RSI,(int)&local_1b8 + 8);
    }
    if ((local_2ae & 1) != 0) {
      if (bVar1) {
        local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
        QPainterPath::QPainterPath((QPainterPath *)&local_1c0);
        QRectF::QRectF((QRectF *)in_stack_fffffffffffffd00,(QRect *)in_stack_fffffffffffffcf8);
        QPainterPath::addRect((QRectF *)&local_1c0);
        rect((QGraphicsWidget *)in_stack_fffffffffffffd08);
        local_250 = ::operator-((QPointF *)in_stack_fffffffffffffcf8);
        QRectF::translated(this_01,(QPointF *)this_00);
        QRectF::adjusted((QRectF *)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08,
                         (qreal)in_stack_fffffffffffffd00,(qreal)in_stack_fffffffffffffcf8,
                         (qreal)in_stack_fffffffffffffcf0);
        QPainterPath::addRect((QRectF *)&local_1c0);
        in_stack_fffffffffffffd10 = in_RSI;
        palette((QGraphicsWidget *)in_stack_fffffffffffffcf8);
        QPalette::window((QPalette *)0xa4fbd7);
        QPainter::fillPath((QPainterPath *)in_stack_fffffffffffffd10,(QBrush *)&local_1c0);
        QPalette::~QPalette(&local_98);
        QPainterPath::~QPainterPath((QPainterPath *)&local_1c0);
      }
      else {
        in_stack_fffffffffffffd08 = in_RSI;
        palette((QGraphicsWidget *)in_stack_fffffffffffffcf8);
        QPalette::window((QPalette *)0xa4fc34);
        QPainter::fillRect((QRect *)in_stack_fffffffffffffd08,(QBrush *)&local_138);
        QPalette::~QPalette(&local_a8);
      }
    }
    QGraphicsWidgetPrivate::titleBarHeight(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    QRect::setHeight((QRect *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
    if (iVar3 == 0) {
      QRect::adjust((QRect *)in_stack_fffffffffffffd00,
                    (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20),(int)in_stack_fffffffffffffcf8,
                    (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),(int)in_stack_fffffffffffffcf0);
    }
    QPainter::save();
    pQVar9 = in_RSI;
    QApplication::font((char *)in_stack_fffffffffffffd08);
    QPainter::setFont((QFont *)pQVar9);
    QFont::~QFont(local_b8);
    pQVar8 = style((QGraphicsWidget *)in_stack_fffffffffffffcf8);
    (**(code **)(*(long *)pQVar8 + 200))(pQVar8,5,local_88,in_RSI,in_RCX);
    QPainter::restore();
    if (bVar2 != 0) {
      QPainter::restore();
    }
    memset(local_108,0xaa,0x50);
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0xa4fd75);
    QStyleOption::operator=
              ((QStyleOption *)in_stack_fffffffffffffcf0,
               (QStyleOption *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    (**(code **)(*in_RDI + 0x98))(in_RDI,local_108);
    if (iVar3 != 0) {
      in_stack_fffffffffffffcf8 = in_RSI;
      local_260 = QRect::adjusted((QRect *)CONCAT17(bVar10,in_stack_fffffffffffffd28),
                                  (int)((ulong)this_01 >> 0x20),(int)this_01,
                                  (int)((ulong)this_00 >> 0x20),(int)this_00);
      QPainter::setClipRect((QRect *)in_stack_fffffffffffffcf8,(ClipOperation)&local_260);
    }
    pQVar9 = (QStyleOptionTitleBar *)auStack_100;
    QGraphicsItem::hasFocus((QGraphicsItem *)in_stack_fffffffffffffcf8);
    QFlags<QStyle::StateFlag>::setFlag
              ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffd10,
               (StateFlag)((ulong)in_stack_fffffffffffffd08 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
    isActiveWindow((QGraphicsWidget *)0xa4fe33);
    QFlags<QStyle::StateFlag>::setFlag
              ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffd10,
               (StateFlag)((ulong)in_stack_fffffffffffffd08 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd08 >> 0x18,0));
    QPalette::setCurrentColorGroup(&QStack_e0,Active);
    auStack_100._8_8_ = local_138;
    local_f0 = local_130;
    pQVar8 = style((QGraphicsWidget *)in_stack_fffffffffffffcf8);
    local_c8 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x2c,0,in_RCX);
    local_c4 = 1;
    pQVar8 = style((QGraphicsWidget *)in_stack_fffffffffffffcf8);
    (**(code **)(*(long *)pQVar8 + 0xb0))(pQVar8,9,local_108,in_RSI,in_RCX);
    QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0xa4ff0b);
    QStyleHintReturnMask::~QStyleHintReturnMask((QStyleHintReturnMask *)pQVar9);
    QStyleOptionTitleBar::~QStyleOptionTitleBar(pQVar9);
  }
  else if (((local_2ae & 1) != 0) && (!bVar1)) {
    pQVar7 = (QBrush *)(in_RDX + 0x40);
    palette((QGraphicsWidget *)in_stack_fffffffffffffcf8);
    QPalette::window((QPalette *)0xa4f76c);
    QPainter::fillRect((QRectF *)in_RSI,pQVar7);
    QPalette::~QPalette(&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::paintWindowFrame(QPainter *painter, const QStyleOptionGraphicsItem *option,
                                       QWidget *widget)
{
    const bool fillBackground = !testAttribute(Qt::WA_OpaquePaintEvent)
                                && !testAttribute(Qt::WA_NoSystemBackground);
    QGraphicsProxyWidget *proxy = qobject_cast<QGraphicsProxyWidget *>(this);
    const bool embeddedWidgetFillsOwnBackground = proxy && proxy->widget();

    if (rect().contains(option->exposedRect)) {
        if (fillBackground && !embeddedWidgetFillsOwnBackground)
            painter->fillRect(option->exposedRect, palette().window());
        return;
    }

    Q_D(QGraphicsWidget);

    QRect windowFrameRect = QRect(QPoint(), windowFrameGeometry().size().toSize());
    QStyleOptionTitleBar bar;
    bar.QStyleOption::operator=(*option);
    d->initStyleOptionTitleBar(&bar);   // this clear flags in bar.state
    d->ensureWindowData();
    bar.state.setFlag(QStyle::State_MouseOver, d->windowData->buttonMouseOver);
    bar.state.setFlag(QStyle::State_Sunken, d->windowData->buttonSunken);
    bar.rect = windowFrameRect;

    // translate painter to make the style happy
    const QPointF styleOrigin = this->windowFrameRect().topLeft();
    painter->translate(styleOrigin);

#ifdef Q_OS_MAC
    const QSize pixmapSize = windowFrameRect.size();
    if (pixmapSize.width() <= 0 || pixmapSize.height() <= 0)
        return;
    QPainter *realPainter = painter;
    QPixmap pm(pixmapSize);
    painter = new QPainter(&pm);
#endif

    // Fill background
    QStyleHintReturnMask mask;
    bool setMask = style()->styleHint(QStyle::SH_WindowFrame_Mask, &bar, widget, &mask) && !mask.region.isEmpty();
    bool hasBorder = !style()->styleHint(QStyle::SH_TitleBar_NoBorder, &bar, widget);
    int frameWidth = style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, &bar, widget);
    if (setMask) {
        painter->save();
        painter->setClipRegion(mask.region, Qt::IntersectClip);
    }
    if (fillBackground) {
        if (embeddedWidgetFillsOwnBackground) {
            // Don't fill the background twice.
            QPainterPath windowFrameBackground;
            windowFrameBackground.addRect(windowFrameRect);
            // Adjust with 0.5 to avoid border artifacts between
            // widget background and frame background.
            windowFrameBackground.addRect(rect().translated(-styleOrigin).adjusted(0.5, 0.5, -0.5, -0.5));
            painter->fillPath(windowFrameBackground, palette().window());
        } else {
            painter->fillRect(windowFrameRect, palette().window());
        }
    }

    // Draw title
    int height = (int)d->titleBarHeight(bar);
    bar.rect.setHeight(height);
    if (hasBorder) // Frame is painted by PE_FrameWindow
        bar.rect.adjust(frameWidth, frameWidth, -frameWidth, 0);

    painter->save();
    painter->setFont(QApplication::font("QMdiSubWindowTitleBar"));
    style()->drawComplexControl(QStyle::CC_TitleBar, &bar, painter, widget);
    painter->restore();
    if (setMask)
        painter->restore();
    // Draw window frame
    QStyleOptionFrame frameOptions;
    frameOptions.QStyleOption::operator=(*option);
    initStyleOption(&frameOptions);
    if (!hasBorder)
        painter->setClipRect(windowFrameRect.adjusted(0, +height, 0, 0), Qt::IntersectClip);
    frameOptions.state.setFlag(QStyle::State_HasFocus, hasFocus());
    bool isActive = isActiveWindow();
    frameOptions.state.setFlag(QStyle::State_Active, isActive);

    frameOptions.palette.setCurrentColorGroup(isActive ? QPalette::Active : QPalette::Normal);
    frameOptions.rect = windowFrameRect;
    frameOptions.lineWidth = style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, widget);
    frameOptions.midLineWidth = 1;
    style()->drawPrimitive(QStyle::PE_FrameWindow, &frameOptions, painter, widget);

#ifdef Q_OS_MAC
    realPainter->drawPixmap(QPoint(), pm);
    delete painter;
#endif
}